

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

Vec_Int_t *
Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Vec_Int_t *vNodeFrames,Vec_Int_t *vFanins)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar5;
  uint uVar6;
  int iVar7;
  Wlc_Obj_t *pObj;
  long lVar8;
  
  iVar3 = vNodeFrames->nSize;
  iVar7 = iVar3 * 2;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar3 * 2 - 1U) {
    iVar2 = iVar7;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  if (iVar2 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar2 << 2);
  }
  iVar2 = 0;
  p_00->pArray = piVar4;
  if (0 < iVar3) {
    lVar8 = 0;
    do {
      uVar6 = vNodeFrames->pArray[lVar8] >> 0xb;
      if (((int)uVar6 < 1) || (p->nObjsAlloc <= (int)uVar6)) {
LAB_00339a50:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pObj = p->pObjs + uVar6;
      if ((*(ushort *)pObj & 0x3f) - 0x36 < 2) {
        paVar5 = &pObj->field_10;
        if (2 < pObj->nFanins) {
          paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar5->pFanins[0];
        }
        uVar6 = paVar5->Fanins[1];
      }
      else {
        if ((*(ushort *)pObj & 0x3f) != 8) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                        ,0x158,
                        "Vec_Int_t *Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        paVar5 = &pObj->field_10;
        if (2 < pObj->nFanins) {
          paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar5->pFanins[0];
        }
        uVar6 = paVar5->Fanins[0];
      }
      if (((int)uVar6 < 1) || ((uint)p->nObjsAlloc <= uVar6)) goto LAB_00339a50;
      iVar3 = Wlc_NtkDupOneObject(pNew,p,p->pObjs + uVar6,3,vFanins);
      Vec_IntPush(p_00,iVar3);
      uVar1 = *(ushort *)pObj & 0x3f;
      if (uVar1 == 8) {
        iVar3 = 0;
      }
      else {
        if (uVar1 != 0x36) {
          if (uVar1 != 0x37) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                          ,0x161,
                          "Vec_Int_t *Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          paVar5 = &pObj->field_10;
          if (2 < pObj->nFanins) {
            paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar5->pFanins[0];
          }
          iVar3 = paVar5[1].Fanins[0];
          if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_00339a50;
          pObj = p->pObjs + iVar3;
        }
        iVar3 = Wlc_NtkDupOneObject(pNew,p,pObj,3,vFanins);
      }
      Vec_IntPush(p_00,iVar3);
      lVar8 = lVar8 + 1;
    } while (lVar8 < vNodeFrames->nSize);
    iVar2 = p_00->nSize;
    iVar7 = vNodeFrames->nSize * 2;
  }
  if (iVar2 == iVar7) {
    return p_00;
  }
  __assert_fail("Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                ,0x164,
                "Vec_Int_t *Wlc_NtkAbsCreateFlopOutputs(Wlc_Ntk_t *, Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Int_t * Wlc_NtkAbsCreateFlopOutputs( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Vec_Int_t * vNodeFrames, Vec_Int_t * vFanins ) 
{
    Vec_Int_t * vNewObjs = Vec_IntAlloc( 2*Vec_IntSize(vNodeFrames) );
    Wlc_Obj_t * pObj, * pFanin = NULL;
    int i, Entry, iObj, iFrame;
    Vec_IntForEachEntry( vNodeFrames, Entry, i )
    {
        iObj   = Entry >> 11;
        iFrame = (Entry >> 1) & 0x3FF;
        pObj   = Wlc_NtkObj( p, iObj );
        // address
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            pFanin = Wlc_ObjFanin0(p, pObj);
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
            pFanin = Wlc_ObjFanin1(p, pObj);
        else assert( 0 );
        Vec_IntPush( vNewObjs, Wlc_NtkDupOneObject(pNew, p, pFanin, WLC_OBJ_FO, vFanins) );
        // data
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
            pFanin = NULL;
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
            pFanin = pObj;
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
            pFanin = Wlc_ObjFanin2(p, pObj);
        else assert( 0 );
        Vec_IntPush( vNewObjs, pFanin ? Wlc_NtkDupOneObject(pNew, p, pFanin, WLC_OBJ_FO, vFanins) : 0 );
    }
    assert( Vec_IntSize(vNewObjs) == 2 * Vec_IntSize(vNodeFrames) );
    return vNewObjs;
}